

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

bool anyFeatureDescriptionOfDescription<CoreML::Specification::ModelDescription>
               (ModelDescription *description,
               function<bool_(const_CoreML::Specification::FeatureDescription_&)> *criteria)

{
  bool bVar1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar2;
  reference pFVar3;
  FeatureDescription *fd_2;
  const_iterator __end0_2;
  const_iterator __begin0_2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1_2;
  FeatureDescription *fd_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1_1;
  FeatureDescription *fd;
  const_iterator __end0;
  const_iterator __begin0;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  function<bool_(const_CoreML::Specification::FeatureDescription_&)> *criteria_local;
  ModelDescription *description_local;
  
  pRVar2 = CoreML::Specification::ModelDescription::input(description);
  __end0 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                     (pRVar2);
  fd = (FeatureDescription *)
       google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar2);
  while( true ) {
    bVar1 = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                      (&__end0,(iterator *)&fd);
    if (!bVar1) {
      pRVar2 = CoreML::Specification::ModelDescription::output(description);
      __end0_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                 begin(pRVar2);
      fd_1 = (FeatureDescription *)
             google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                       (pRVar2);
      while( true ) {
        bVar1 = google::protobuf::internal::
                RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                          (&__end0_1,(iterator *)&fd_1);
        if (!bVar1) {
          pRVar2 = CoreML::Specification::ModelDescription::state(description);
          __end0_2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::
                     begin(pRVar2);
          fd_2 = (FeatureDescription *)
                 google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                           (pRVar2);
          while( true ) {
            bVar1 = google::protobuf::internal::
                    RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                              (&__end0_2,(iterator *)&fd_2);
            if (!bVar1) {
              return false;
            }
            pFVar3 = google::protobuf::internal::
                     RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                               (&__end0_2);
            bVar1 = std::function<bool_(const_CoreML::Specification::FeatureDescription_&)>::
                    operator()(criteria,pFVar3);
            if (bVar1) break;
            google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++
                      (&__end0_2);
          }
          return true;
        }
        pFVar3 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                           (&__end0_1);
        bVar1 = std::function<bool_(const_CoreML::Specification::FeatureDescription_&)>::operator()
                          (criteria,pFVar3);
        if (bVar1) break;
        google::protobuf::internal::
        RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end0_1);
      }
      return true;
    }
    pFVar3 = google::protobuf::internal::
             RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                       (&__end0);
    bVar1 = std::function<bool_(const_CoreML::Specification::FeatureDescription_&)>::operator()
                      (criteria,pFVar3);
    if (bVar1) break;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end0);
  }
  return true;
}

Assistant:

static bool anyFeatureDescriptionOfDescription(const Description &description,
                                               std::function<bool(const Specification::FeatureDescription& fd)> criteria) {
    for (const auto& fd: description.input()) {
        if (criteria(fd)) {
            return true;
        }
    }

    for (const auto& fd: description.output()) {
        if (criteria(fd)) {
            return true;
        }
    }

    for (const auto& fd: description.state()) {
        if (criteria(fd)) {
            return true;
        }
    }
    return false;
}